

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O0

int __thiscall moira::Moira::cyclesBit<(moira::Core)0,(moira::Instr)29>(Moira *this,u8 bit)

{
  u8 bit_local;
  Moira *this_local;
  
  return 4;
}

Assistant:

int
Moira::cyclesBit(u8 bit) const
{
    switch (I)
    {
        case Instr::BTST: return 2;
        case Instr::BCLR: return MOIRA_MIMIC_MUSASHI ? 6 : (bit > 15 ? 6 : 4);
        case Instr::BSET:
        case Instr::BCHG: return MOIRA_MIMIC_MUSASHI ? 4 : (bit > 15 ? 4 : 2);

        default:
            fatalError;
    }
}